

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O0

int Cudd_zddPrintDebug(DdManager *zdd,DdNode *f,int n,int pr)

{
  uint uVar1;
  int iVar2;
  double dVar3;
  uint local_44;
  int retval;
  double minterms;
  int nodes;
  DdNode *empty;
  int pr_local;
  int n_local;
  DdNode *f_local;
  DdManager *zdd_local;
  
  local_44 = 1;
  if ((f == zdd->zero) && (0 < pr)) {
    fprintf((FILE *)zdd->out,": is the empty ZDD\n");
    fflush((FILE *)zdd->out);
    zdd_local._4_4_ = 1;
  }
  else {
    if (0 < pr) {
      uVar1 = Cudd_zddDagSize(f);
      local_44 = (uint)(uVar1 != 0xffffffff);
      dVar3 = Cudd_zddCountMinterm(zdd,f,n);
      if ((dVar3 == -1.0) && (!NAN(dVar3))) {
        local_44 = 0;
      }
      fprintf((FILE *)zdd->out,": %d nodes %g minterms\n",dVar3,(ulong)uVar1);
      if ((2 < pr) && (iVar2 = cuddZddP(zdd,f), iVar2 == 0)) {
        local_44 = 0;
      }
      if ((pr == 2) || (3 < pr)) {
        iVar2 = Cudd_zddPrintMinterm(zdd,f);
        if (iVar2 == 0) {
          local_44 = 0;
        }
        fprintf((FILE *)zdd->out,"\n");
      }
      fflush((FILE *)zdd->out);
    }
    zdd_local._4_4_ = local_44;
  }
  return zdd_local._4_4_;
}

Assistant:

int
Cudd_zddPrintDebug(
  DdManager * zdd,
  DdNode * f,
  int  n,
  int  pr)
{
    DdNode      *empty = DD_ZERO(zdd);
    int         nodes;
    double      minterms;
    int         retval = 1;

    if (f == empty && pr > 0) {
        (void) fprintf(zdd->out,": is the empty ZDD\n");
        (void) fflush(zdd->out);
        return(1);
    }

    if (pr > 0) {
        nodes = Cudd_zddDagSize(f);
        if (nodes == CUDD_OUT_OF_MEM) retval = 0;
        minterms = Cudd_zddCountMinterm(zdd, f, n);
        if (minterms == (double)CUDD_OUT_OF_MEM) retval = 0;
        (void) fprintf(zdd->out,": %d nodes %g minterms\n",
                       nodes, minterms);
        if (pr > 2)
            if (!cuddZddP(zdd, f)) retval = 0;
        if (pr == 2 || pr > 3) {
            if (!Cudd_zddPrintMinterm(zdd, f)) retval = 0;
            (void) fprintf(zdd->out,"\n");
        }
        (void) fflush(zdd->out);
    }
    return(retval);

}